

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_help.cpp
# Opt level: O0

void __thiscall Help_SwitchStrings_Test::Help_SwitchStrings_Test(Help_SwitchStrings_Test *this)

{
  Help_SwitchStrings_Test *this_local;
  
  anon_unknown.dwarf_58649::Help::Help(&this->super_Help);
  (this->super_Help).super_Test._vptr_Test = (_func_int **)&PTR__Help_SwitchStrings_Test_00246ba8;
  return;
}

Assistant:

TEST_F (Help, SwitchStrings) {
    // auto get_switch_strings (options_set const & ops) -> switch_strings {

    // This option has a name in Katakana to verify that we are counting unicode code-points and not
    // UTF-8 code-units.
    pstore::gsl::czstring const name = "\xE3\x82\xAA"  // KATAKANA LETTER O
                                       "\xE3\x83\x97"  // KATAKANA LETTER PU
                                       "\xE3\x82\xB7"  // KATAKANA LETTER SI
                                       "\xE3\x83\xA7"  // KATAKANA LETTER SMALL YO
                                       "\xE3\x83\xB3"; // KATAKANA LETTER N
    opt<std::string> option1{name};
    details::options_set options{&option1};
    details::switch_strings const actual = details::get_switch_strings (options);

    ASSERT_EQ (actual.size (), 1U);
    auto it = std::begin (actual);
    EXPECT_EQ (it->first, &option1);
    ASSERT_EQ (it->second.size (), 1U);
    EXPECT_EQ (it->second[0], std::make_tuple ("--"s + name + "=<str>", std::size_t{13}));
}